

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void testStartsWith(void)

{
  FILE *pFVar1;
  bool bVar2;
  allocator<char> local_49;
  string prefix;
  string source;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source,"tititoto",(allocator<char> *)&prefix);
  std::__cxx11::string::string<std::allocator<char>>((string *)&prefix,"titi",&local_49);
  test_count = test_count + 1;
  bVar2 = crawler::startsWith(&prefix,&source);
  pFVar1 = _stderr;
  if (bVar2) {
    test_pass = test_pass + 1;
  }
  else {
    bVar2 = crawler::startsWith(&prefix,&source);
    fprintf(pFVar1,"function %s(): %s:%d  Assertion `%s` failed. expect: %d actual: %d\n",
            "testStartsWith",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0x28,"(1) == (crawler::startsWith(prefix, source))",1,(ulong)bVar2);
  }
  std::__cxx11::string::assign((char *)&prefix);
  test_count = test_count + 1;
  bVar2 = crawler::startsWith(&prefix,&source,2,6);
  pFVar1 = _stderr;
  if (bVar2) {
    test_pass = test_pass + 1;
  }
  else {
    bVar2 = crawler::startsWith(&prefix,&source,2,6);
    fprintf(pFVar1,"function %s(): %s:%d  Assertion `%s` failed. expect: %d actual: %d\n",
            "testStartsWith",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0x2a,"(true) == (crawler::startsWith(prefix, source, 2, 6))",1,(ulong)bVar2);
  }
  std::__cxx11::string::~string((string *)&prefix);
  std::__cxx11::string::~string((string *)&source);
  return;
}

Assistant:

void testStartsWith() {
  const std::string source = "tititoto";
  std::string prefix = "titi";
  ASSERT_INT_EQ(1, crawler::startsWith(prefix, source));
  prefix = "tito";
  ASSERT_INT_EQ(true, crawler::startsWith(prefix, source, 2, 6));
}